

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O3

void xmlSAX2StartDocument(void *ctx)

{
  xmlDictPtr dict;
  htmlDocPtr pxVar1;
  xmlDocPtr pxVar2;
  xmlChar *pxVar3;
  
  if (ctx != (void *)0x0) {
    if (*(int *)((long)ctx + 0x34) == 0) {
      pxVar2 = xmlNewDoc(*(xmlChar **)((long)ctx + 0x20));
      *(xmlDocPtr *)((long)ctx + 0x10) = pxVar2;
      if (pxVar2 == (xmlDocPtr)0x0) goto LAB_0014845f;
      pxVar2->properties = *(uint *)((long)ctx + 0x234) >> 0xf & 4;
      pxVar2->parseFlags = *(int *)((long)ctx + 0x234);
      pxVar2->standalone = *(int *)((long)ctx + 0x30);
      if (*(int *)((long)ctx + 0x238) != 0) {
        dict = *(xmlDictPtr *)((long)ctx + 0x1c8);
        pxVar2->dict = dict;
        xmlDictReference(dict);
      }
    }
    else {
      pxVar1 = *(htmlDocPtr *)((long)ctx + 0x10);
      if (pxVar1 == (htmlDocPtr)0x0) {
        pxVar1 = htmlNewDocNoDtD((xmlChar *)0x0,(xmlChar *)0x0);
        *(htmlDocPtr *)((long)ctx + 0x10) = pxVar1;
        if (pxVar1 == (htmlDocPtr)0x0) goto LAB_0014845f;
      }
      pxVar1->properties = 0x80;
      pxVar1->parseFlags = *(int *)((long)ctx + 0x234);
    }
    if ((((*(long *)((long)ctx + 0x10) != 0) && (*(long *)(*(long *)((long)ctx + 0x10) + 0x88) == 0)
         ) && (*(long *)((long)ctx + 0x38) != 0)) &&
       (pxVar3 = *(xmlChar **)(*(long *)((long)ctx + 0x38) + 8), pxVar3 != (xmlChar *)0x0)) {
      pxVar3 = xmlPathToURI(pxVar3);
      *(xmlChar **)(*(long *)((long)ctx + 0x10) + 0x88) = pxVar3;
      if (pxVar3 == (xmlChar *)0x0) {
LAB_0014845f:
        xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
        return;
      }
    }
  }
  return;
}

Assistant:

void
xmlSAX2StartDocument(void *ctx)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlDocPtr doc;

    if (ctx == NULL) return;

#ifdef LIBXML_HTML_ENABLED
    if (ctxt->html) {
	if (ctxt->myDoc == NULL)
	    ctxt->myDoc = htmlNewDocNoDtD(NULL, NULL);
	if (ctxt->myDoc == NULL) {
	    xmlSAX2ErrMemory(ctxt);
	    return;
	}
	ctxt->myDoc->properties = XML_DOC_HTML;
	ctxt->myDoc->parseFlags = ctxt->options;
    } else
#endif
    {
	doc = ctxt->myDoc = xmlNewDoc(ctxt->version);
	if (doc != NULL) {
	    doc->properties = 0;
	    if (ctxt->options & XML_PARSE_OLD10)
	        doc->properties |= XML_DOC_OLD10;
	    doc->parseFlags = ctxt->options;
	    doc->standalone = ctxt->standalone;
	} else {
	    xmlSAX2ErrMemory(ctxt);
	    return;
	}
	if ((ctxt->dictNames) && (doc != NULL)) {
	    doc->dict = ctxt->dict;
	    xmlDictReference(doc->dict);
	}
    }
    if ((ctxt->myDoc != NULL) && (ctxt->myDoc->URL == NULL) &&
	(ctxt->input != NULL) && (ctxt->input->filename != NULL)) {
	ctxt->myDoc->URL = xmlPathToURI((const xmlChar *)ctxt->input->filename);
	if (ctxt->myDoc->URL == NULL)
	    xmlSAX2ErrMemory(ctxt);
    }
}